

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O0

void vociadd(voccxdef *ctx,objnum obj,objnum loc,int numsc,objnum *sc,int flags)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  uchar *puVar4;
  uint in_ECX;
  uint uVar5;
  undefined2 in_DX;
  ushort in_SI;
  long in_RDI;
  void *in_R8;
  byte in_R9B;
  int i;
  uint need;
  vocidef *minprv;
  vocidef *prv;
  vocidef *min;
  vocidef *v;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar6;
  undefined2 in_stack_ffffffffffffffbc;
  objnum in_stack_ffffffffffffffbe;
  voccxdef *in_stack_ffffffffffffffc0;
  voccxdef *ctx_00;
  voccxdef *siz;
  voccxdef *pvVar7;
  voccxdef *ctx_01;
  voccxdef *local_28;
  
  vocialo(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe);
  pvVar7 = (voccxdef *)0x0;
  siz = (voccxdef *)0x0;
  for (local_28 = *(voccxdef **)(in_RDI + 0x558);
      (ctx_00 = in_stack_ffffffffffffffc0, ctx_01 = pvVar7, local_28 != (voccxdef *)0x0 &&
      (ctx_00 = siz, ctx_01 = local_28, *(byte *)&local_28->voccxerr != in_ECX));
      local_28 = (voccxdef *)local_28->voccxtio) {
    if (((int)in_ECX < (int)(uint)*(byte *)&local_28->voccxerr) &&
       ((pvVar7 == (voccxdef *)0x0 || (*(byte *)&local_28->voccxerr < *(byte *)&pvVar7->voccxerr))))
    {
      in_stack_ffffffffffffffc0 = siz;
      pvVar7 = local_28;
    }
    siz = local_28;
  }
  if (ctx_01 == (voccxdef *)0x0) {
    sVar3 = osrndsz((long)(int)(in_ECX - 1) * 2 + 0x10);
    in_stack_ffffffffffffffbc = (undefined2)sVar3;
    in_stack_ffffffffffffffbe = (objnum)(sVar3 >> 0x10);
    if (0x1fff < (uint)(*(int *)(in_RDI + 0x564) + (int)sVar3)) {
      puVar4 = mchalo((errcxdef *)ctx_01,(size_t)siz,(char *)ctx_00);
      uVar5 = *(int *)(in_RDI + 0x560) + 1;
      *(uint *)(in_RDI + 0x560) = uVar5;
      *(uchar **)(in_RDI + 0x458 + (ulong)uVar5 * 8) = puVar4;
      *(undefined4 *)(in_RDI + 0x564) = 0;
    }
    lVar1 = *(long *)(in_RDI + 0x458 + (ulong)*(uint *)(in_RDI + 0x560) * 8);
    uVar5 = *(uint *)(in_RDI + 0x564);
    *(int *)(in_RDI + 0x564) =
         CONCAT22(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc) + *(int *)(in_RDI + 0x564);
    local_28 = (voccxdef *)(lVar1 + (ulong)uVar5);
  }
  else {
    local_28 = ctx_01;
    if (ctx_00 == (voccxdef *)0x0) {
      *(tiocxdef **)(in_RDI + 0x558) = ctx_01->voccxtio;
    }
    else {
      ctx_00->voccxtio = ctx_01->voccxtio;
    }
  }
  if (*(long *)(*(long *)(in_RDI + 0x58 + (long)((int)(uint)in_SI >> 8) * 8) +
               (long)(int)(in_SI & 0xff) * 8) == 0) {
    *(undefined2 *)((long)&local_28->voccxtio + 2) = in_DX;
    *(undefined2 *)((long)&local_28->voccxtio + 4) = 0xffff;
    *(byte *)&local_28->voccxtio = in_R9B & 0xfb;
    *(char *)&local_28->voccxerr = (char)in_ECX;
    if (in_ECX != 0) {
      if ((in_R9B & 4) == 0) {
        memcpy((void *)((long)&local_28->voccxtio + 6),in_R8,(long)(int)in_ECX << 1);
      }
      else {
        for (iVar6 = 0; iVar6 < (int)in_ECX; iVar6 = iVar6 + 1) {
          iVar2 = osrp2((void *)((long)in_R8 + (long)iVar6 * 2));
          *(short *)((long)local_28->voccxinh + (long)iVar6 * 2 + -0x4a) = (short)iVar2;
        }
      }
    }
    *(voccxdef **)
     (*(long *)(in_RDI + 0x58 + (long)((int)(uint)in_SI >> 8) * 8) + (long)(int)(in_SI & 0xff) * 8)
         = local_28;
    return;
  }
  errsigf((errcxdef *)ctx_00,
          (char *)CONCAT26(in_stack_ffffffffffffffbe,
                           CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),0);
}

Assistant:

void vociadd(voccxdef *ctx, objnum obj, objnum loc,
             int numsc, objnum *sc, int flags)
{
    vocidef *v;
    vocidef *min;
    vocidef *prv;
    vocidef *minprv;

    /* make sure we have a page table entry for this object */
    vocialo(ctx, obj);

    /* look in free list for an entry that's big enough */
    for (prv = (vocidef *)0, min = (vocidef *)0, v = ctx->voccxifr ; v ;
         prv = v, v = v->vocinxt)
    {
        if (v->vocinsc == numsc)
        {
            min = v;
            minprv = prv;
            break;
        }
        else if (v->vocinsc > numsc)
        {
            if (!min || v->vocinsc < min->vocinsc)
            {
                min = v;
                minprv = prv;
            }
        }
    }
    
    if (!min)
    {
        uint need;
        
        /* nothing in free list; allocate a new entry */
        need = osrndsz(sizeof(vocidef) + (numsc - 1)*sizeof(objnum));
        if (ctx->voccxilst + need >= VOCISIZ)
        {
            /* nothing left on current page; allocate a new page */
            ctx->voccxip[++(ctx->voccxiplst)] =
                mchalo(ctx->voccxerr, VOCISIZ, "vociadd");
            ctx->voccxilst = 0;
        }

        /* allocate space out of current page */
        v = (vocidef *)(ctx->voccxip[ctx->voccxiplst] + ctx->voccxilst);
        ctx->voccxilst += need;
    }
    else
    {
        /* unlink from chain and use */
        v = min;
        if (minprv)
            minprv->vocinxt = v->vocinxt;
        else
            ctx->voccxifr = v->vocinxt;
    }

    /* set up the entry */
    if (vocinh(ctx, obj) != (vocidef *)0) errsig(ctx->voccxerr, ERR_VOCINUS);
    v->vociloc = loc;
    v->vociilc = MCMONINV;
    v->vociflg = (flags & ~VOCIFXLAT);
    v->vocinsc = numsc;
    if (numsc)
    {
        if (flags & VOCIFXLAT)
        {
            int i;
            
            for (i = 0 ; i < numsc ; ++i)
                v->vocisc[i] = osrp2(&sc[i]);
        }
        else
            memcpy(v->vocisc, sc, (size_t)(numsc * sizeof(objnum)));
    }
    vocinh(ctx, obj) = v;                           /* set page table entry */
}